

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

uint16_t decompress(uint16_t x,int bits)

{
  byte bVar1;
  uint32_t lower;
  uint32_t remainder;
  uint32_t power;
  uint32_t product;
  int bits_local;
  uint16_t x_local;
  
  bVar1 = (byte)bits;
  return (short)((uint)x * 0xd01 >> (bVar1 & 0x1f)) +
         (short)(((uint)x * 0xd01 & (1 << (bVar1 & 0x1f)) - 1U) >> (bVar1 - 1 & 0x1f));
}

Assistant:

static uint16_t decompress(uint16_t x, int bits) {
  uint32_t product = (uint32_t)x * kPrime;
  uint32_t power = 1 << bits;
  // This is |product| % power, since |power| is a power of 2.
  uint32_t remainder = product & (power - 1);
  // This is |product| / power, since |power| is a power of 2.
  uint32_t lower = product >> bits;
  // The rounding logic works since the first half of numbers mod |power| have a
  // 0 as first bit, and the second half has a 1 as first bit, since |power| is
  // a power of 2. As a 12 bit number, |remainder| is always positive, so we
  // will shift in 0s for a right shift.
  return lower + (remainder >> (bits - 1));
}